

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSiteNameCommand.h
# Opt level: O0

cmCommand * __thiscall cmSiteNameCommand::Clone(cmSiteNameCommand *this)

{
  cmCommand *this_00;
  cmSiteNameCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmSiteNameCommand((cmSiteNameCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmSiteNameCommand; }